

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O0

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoPoint>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoPoint>_> *this,int64_t id,
          TPZVec<long> *nodeindexes,int matind,TPZGeoMesh *mesh)

{
  undefined4 in_ECX;
  TPZRegisterClassId *in_RDI;
  void **in_R8;
  TPZGeoMesh *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  TPZVec<long> *nodeindexes_00;
  int64_t id_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  id_00 = 0;
  nodeindexes_00 = (TPZVec<long> *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoPoint>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024c3a10);
  TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
            ((TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             in_R8,id_00,nodeindexes_00,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZGeoElMapped_024c36c8;
  *(undefined ***)in_RDI = &PTR__TPZGeoElMapped_024c36c8;
  TPZFNMatrix<0,_double>::TPZFNMatrix
            ((TPZFNMatrix<0,_double> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int64_t)in_R8,
             id_00,(double *)nodeindexes_00);
  return;
}

Assistant:

TPZGeoElMapped(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
	TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(id,nodeindexes,matind,mesh), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}